

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O3

ecs_iter_t *
ecs_scope_iter(ecs_iter_t *__return_storage_ptr__,ecs_world_t *world,ecs_entity_t parent)

{
  ecs_vector_t *peVar1;
  
  *(ecs_match_kind_t *)((long)&__return_storage_ptr__->iter + 0x10) = EcsMatchDefault;
  *(ecs_match_kind_t *)((long)&__return_storage_ptr__->iter + 0x14) = EcsMatchDefault;
  (__return_storage_ptr__->iter).parent.filter.include = (ecs_type_t)0x0;
  (__return_storage_ptr__->iter).parent.filter.exclude = (ecs_type_t)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->iter + 0x20) = 0;
  (__return_storage_ptr__->iter).parent.table.columns = (int32_t *)0x0;
  (__return_storage_ptr__->iter).parent.table.table = (ecs_table_t *)0x0;
  (__return_storage_ptr__->iter).parent.table.data = (ecs_data_t *)0x0;
  (__return_storage_ptr__->iter).parent.table.components = (ecs_entity_t *)0x0;
  (__return_storage_ptr__->iter).parent.table.types = (ecs_type_t *)0x0;
  (__return_storage_ptr__->iter).parent.table.references = (ecs_ref_t *)0x0;
  peVar1 = (ecs_vector_t *)_ecs_map_get_ptr(world->child_tables,parent);
  __return_storage_ptr__->world = world;
  __return_storage_ptr__->real_world = (ecs_world_t *)0x0;
  __return_storage_ptr__->system = 0;
  __return_storage_ptr__->kind = EcsQuerySimpleIter;
  __return_storage_ptr__->table = (ecs_iter_table_t *)0x0;
  __return_storage_ptr__->query = (ecs_query_t *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->query + 4) = 0;
  __return_storage_ptr__->inactive_table_count = 0;
  __return_storage_ptr__->column_count = 0;
  __return_storage_ptr__->table_columns = (void *)0x0;
  __return_storage_ptr__->entities = (ecs_entity_t *)0x0;
  __return_storage_ptr__->param = (void *)0x0;
  __return_storage_ptr__->delta_time = 0.0;
  __return_storage_ptr__->delta_system_time = 0.0;
  __return_storage_ptr__->world_time = 0.0;
  __return_storage_ptr__->frame_offset = 0;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->count = 0;
  __return_storage_ptr__->total_count = 0;
  __return_storage_ptr__->triggered_by = (ecs_entities_t *)0x0;
  __return_storage_ptr__->interrupted_by = 0;
  (__return_storage_ptr__->iter).parent.tables = peVar1;
  return __return_storage_ptr__;
}

Assistant:

ecs_iter_t ecs_scope_iter(
    ecs_world_t *world,
    ecs_entity_t parent)
{
    ecs_scope_iter_t iter = {
        .tables = ecs_map_get_ptr(world->child_tables, ecs_vector_t*, parent),
        .index = 0
    };

    return (ecs_iter_t) {
        .world = world,
        .iter.parent = iter
    };
}